

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_compressed_certificate(ptls_t *tls,ptls_iovec_t message)

{
  code *pcVar1;
  undefined8 uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  ptls_iovec_t pVar5;
  ptls_iovec_t pVar6;
  uint8_t *local_80;
  size_t local_78;
  uint8_t *local_70;
  size_t local_68;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  uint8_t *puStack_40;
  int ret;
  uint8_t *uncompressed;
  uint32_t uncompressed_size;
  uint16_t algo;
  uint8_t *end;
  uint8_t *src;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  message_local.base = (uint8_t *)message.len;
  tls_local = (ptls_t *)message.base;
  end = (uint8_t *)((long)&tls_local->ctx + 4);
  _uncompressed_size = message_local.base + (long)(&tls_local->traffic_protection + -1) + 0x58;
  puStack_40 = (uint8_t *)0x0;
  src = (uint8_t *)tls;
  if (tls->ctx->decompress_certificate == (ptls_decompress_certificate_t *)0x0) {
    _capacity._4_4_ = 10;
  }
  else {
    _capacity._4_4_ = ptls_decode16((uint16_t *)((long)&uncompressed + 6),&end,_uncompressed_size);
    if ((_capacity._4_4_ == 0) &&
       (_capacity._4_4_ = ptls_decode24((uint32_t *)&uncompressed,&end,_uncompressed_size),
       _capacity._4_4_ == 0)) {
      if ((uint)uncompressed < 0x10001) {
        puStack_40 = (uint8_t *)malloc((ulong)(uint)uncompressed);
        puVar3 = src;
        if (puStack_40 == (uint8_t *)0x0) {
          _capacity._4_4_ = 0x201;
        }
        else {
          _block_size = 3;
          if ((ulong)((long)_uncompressed_size - (long)end) < 3) {
            _capacity._4_4_ = 0x32;
          }
          else {
            end_1 = (uint8_t *)0x0;
            do {
              puVar4 = end + 1;
              end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end);
              _block_size = _block_size - 1;
              end = puVar4;
            } while (_block_size != 0);
            if (_uncompressed_size + -(long)puVar4 < end_1) {
              _capacity._4_4_ = 0x32;
            }
            else {
              puVar4 = puVar4 + (long)end_1;
              pcVar1 = *(code **)(*(long *)(*(long *)src + 0x98) + 8);
              uVar2 = *(undefined8 *)(*(long *)src + 0x98);
              pVar5 = ptls_iovec_init(puStack_40,(ulong)(uint)uncompressed);
              pVar6 = ptls_iovec_init(end,(long)puVar4 - (long)end);
              local_70 = pVar5.base;
              local_68 = pVar5.len;
              local_80 = pVar6.base;
              local_78 = pVar6.len;
              _capacity._4_4_ =
                   (*pcVar1)(uVar2,puVar3,uncompressed._6_2_,local_70,local_68,local_78,local_80,
                             local_78);
              if (_capacity._4_4_ == 0) {
                end = puVar4;
                if (puVar4 == _uncompressed_size) {
                  _capacity._4_4_ =
                       client_do_handle_certificate
                                 ((ptls_t *)src,puStack_40,puStack_40 + (uint)uncompressed);
                  if (_capacity._4_4_ == 0) {
                    ptls__key_schedule_update_hash
                              (*(ptls_key_schedule_t **)(src + 0x50),(uint8_t *)tls_local,
                               (size_t)message_local.base);
                    src[8] = '\x06';
                    src[9] = '\0';
                    src[10] = '\0';
                    src[0xb] = '\0';
                    _capacity._4_4_ = 0x202;
                  }
                }
                else {
                  _capacity._4_4_ = 0x32;
                }
              }
            }
          }
        }
      }
      else {
        _capacity._4_4_ = 0x2a;
      }
    }
  }
  free(puStack_40);
  return _capacity._4_4_;
}

Assistant:

static int client_handle_compressed_certificate(ptls_t *tls, ptls_iovec_t message)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    uint16_t algo;
    uint32_t uncompressed_size;
    uint8_t *uncompressed = NULL;
    int ret;

    if (tls->ctx->decompress_certificate == NULL) {
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        goto Exit;
    }

    /* decode */
    if ((ret = ptls_decode16(&algo, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode24(&uncompressed_size, &src, end)) != 0)
        goto Exit;
    if (uncompressed_size > 65536) { /* TODO find a sensible number */
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    if ((uncompressed = malloc(uncompressed_size)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    ptls_decode_block(src, end, 3, {
        if ((ret = tls->ctx->decompress_certificate->cb(tls->ctx->decompress_certificate, tls, algo,
                                                        ptls_iovec_init(uncompressed, uncompressed_size),
                                                        ptls_iovec_init(src, end - src))) != 0)
            goto Exit;
        src = end;
    });

    /* handle */
    if ((ret = client_do_handle_certificate(tls, uncompressed, uncompressed + uncompressed_size)) != 0)
        goto Exit;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    free(uncompressed);
    return ret;
}